

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lecturedemodof.cc
# Opt level: O0

void lecturedemo::printDofInfo(DofHandler *dofh)

{
  Entity *entity;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  reference ppEVar7;
  undefined4 extraout_var_00;
  reference peVar8;
  undefined4 extraout_var_01;
  reference plVar9;
  undefined4 extraout_var_02;
  Entity *e_1;
  gdof_idx_t dof_idx;
  gdof_idx_t int_dof;
  iterator __end3;
  iterator __begin3;
  span<const_long,_18446744073709551615UL> *__range3;
  span<const_long,_18446744073709551615UL> intdofarray;
  undefined1 auStack_80 [4];
  int loc_dof_idx;
  span<const_long,_18446744073709551615UL> dofarray;
  size_type no_dofs;
  glb_idx_t e_idx;
  Entity *e;
  iterator __end2;
  iterator __begin2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2;
  dim_t codim;
  undefined1 local_20 [4];
  size_type N_dofs;
  shared_ptr<const_lf::mesh::Mesh> mesh;
  DofHandler *dofh_local;
  
  mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dofh;
  (*dofh->_vptr_DofHandler[8])(local_20);
  uVar2 = (*(mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_vptr__Sp_counted_base[2])();
  poVar5 = std::operator<<((ostream *)&std::cout,"DofHandler(");
  uVar3 = (*(mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_vptr__Sp_counted_base[2])();
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
  poVar5 = std::operator<<(poVar5," dofs):");
  std::operator<<(poVar5,'\n');
  __range2._0_4_ = 0;
  while( true ) {
    peVar6 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
    uVar3 = (**peVar6->_vptr_Mesh)();
    if (uVar3 < (uint)__range2) break;
    peVar6 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
    iVar4 = (*peVar6->_vptr_Mesh[2])(peVar6,(ulong)(uint)__range2);
    __begin2._M_current = (Entity **)CONCAT44(extraout_var,iVar4);
    __end2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
    e = (Entity *)
        std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                  ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                        (&__end2,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                  *)&e);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      ppEVar7 = __gnu_cxx::
                __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                ::operator*(&__end2);
      entity = *ppEVar7;
      peVar6 = std::
               __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_20);
      dofarray._M_extent._M_extent_value._4_4_ = (*peVar6->_vptr_Mesh[5])(peVar6,entity);
      dofarray._M_extent._M_extent_value._0_4_ =
           (*(mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_vptr__Sp_counted_base[3])
                     (mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi,entity);
      iVar4 = (*(mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base[5])
                        (mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi,entity);
      _auStack_80 = (pointer)CONCAT44(extraout_var_00,iVar4);
      poVar5 = lf::mesh::operator<<((ostream *)&std::cout,entity);
      poVar5 = std::operator<<(poVar5,' ');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,dofarray._M_extent._M_extent_value._4_4_);
      poVar5 = std::operator<<(poVar5,": ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)dofarray._M_extent._M_extent_value);
      std::operator<<(poVar5," dofs = [");
      for (intdofarray._M_extent._M_extent_value._4_4_ = 0;
          intdofarray._M_extent._M_extent_value._4_4_ < (uint)dofarray._M_extent._M_extent_value;
          intdofarray._M_extent._M_extent_value._4_4_ =
               intdofarray._M_extent._M_extent_value._4_4_ + 1) {
        peVar8 = std::span<const_long,_18446744073709551615UL>::operator[]
                           ((span<const_long,_18446744073709551615UL> *)auStack_80,
                            (long)(int)intdofarray._M_extent._M_extent_value._4_4_);
        poVar5 = (ostream *)std::ostream::operator<<(&std::cout,*peVar8);
        std::operator<<(poVar5,' ');
      }
      std::operator<<((ostream *)&std::cout,']');
      iVar4 = (*(mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base[6])
                        (mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi,entity);
      __range3 = (span<const_long,_18446744073709551615UL> *)CONCAT44(extraout_var_01,iVar4);
      std::operator<<((ostream *)&std::cout," int = [");
      __end3 = std::span<const_long,_18446744073709551615UL>::begin
                         ((span<const_long,_18446744073709551615UL> *)&__range3);
      int_dof = (gdof_idx_t)
                std::span<const_long,_18446744073709551615UL>::end
                          ((span<const_long,_18446744073709551615UL> *)&__range3);
      while( true ) {
        bVar1 = __gnu_cxx::operator==<const_long_*,_std::span<const_long,_18446744073709551615UL>_>
                          (&__end3,(__normal_iterator<const_long_*,_std::span<const_long,_18446744073709551615UL>_>
                                    *)&int_dof);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        plVar9 = __gnu_cxx::
                 __normal_iterator<const_long_*,_std::span<const_long,_18446744073709551615UL>_>::
                 operator*(&__end3);
        poVar5 = (ostream *)std::ostream::operator<<(&std::cout,*plVar9);
        std::operator<<(poVar5,' ');
        __gnu_cxx::__normal_iterator<const_long_*,_std::span<const_long,_18446744073709551615UL>_>::
        operator++(&__end3);
      }
      poVar5 = std::operator<<((ostream *)&std::cout,']');
      std::operator<<(poVar5,'\n');
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end2);
    }
    __range2._0_4_ = (uint)__range2 + 1;
  }
  for (e_1 = (Entity *)0x0; (long)e_1 < (long)(ulong)uVar2;
      e_1 = (Entity *)((long)&e_1->_vptr_Entity + 1)) {
    iVar4 = (*(mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi)->_vptr__Sp_counted_base[7])
                      (mesh.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi,e_1);
    poVar5 = std::operator<<((ostream *)&std::cout,"dof ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(long)e_1);
    poVar5 = std::operator<<(poVar5," -> ");
    poVar5 = lf::mesh::operator<<(poVar5,(Entity *)CONCAT44(extraout_var_02,iVar4));
    poVar5 = std::operator<<(poVar5," ");
    peVar6 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
    uVar3 = (*peVar6->_vptr_Mesh[5])(peVar6,(Entity *)CONCAT44(extraout_var_02,iVar4));
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    std::operator<<(poVar5,'\n');
  }
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr((shared_ptr<const_lf::mesh::Mesh> *)local_20);
  return;
}

Assistant:

void printDofInfo(const lf::assemble::DofHandler &dofh) {
  // Obtain pointer to the underlying mesh
  auto mesh = dofh.Mesh();
  // Number of degrees of freedom managed by the DofHandler object
  const lf::assemble::size_type N_dofs(dofh.NumDofs());
  std::cout << "DofHandler(" << dofh.NumDofs() << " dofs):" << '\n';
  // Output information about dofs for entities of all co-dimensions
  for (lf::base::dim_t codim = 0; codim <= mesh->DimMesh(); codim++) {
    // Visit all entities of a codimension codim
    for (const lf::mesh::Entity* e : mesh->Entities(codim)) {
      // Fetch unique index of current entity supplied by mesh object
      const lf::base::glb_idx_t e_idx = mesh->Index(*e);
      // Number of shape functions covering current entity
      const lf::assemble::size_type no_dofs(dofh.NumLocalDofs(*e));
      // Obtain global indices of those shape functions ...
      const std::span<const lf::assemble::gdof_idx_t> dofarray{
          dofh.GlobalDofIndices(*e)};
      // and print them
      std::cout << *e << ' ' << e_idx << ": " << no_dofs << " dofs = [";
      for (int loc_dof_idx = 0; loc_dof_idx < no_dofs; ++loc_dof_idx) {
        std::cout << dofarray[loc_dof_idx] << ' ';
      }
      std::cout << ']';
      // Also output indices of interior shape functions
      const std::span<const lf::assemble::gdof_idx_t>
	intdofarray{dofh.InteriorGlobalDofIndices(*e)};
      std::cout << " int = [";
      for (const lf::assemble::gdof_idx_t int_dof : intdofarray) {
        std::cout << int_dof << ' ';
      }
      std::cout << ']' << '\n';
    }
  }
  // List entities associated with the dofs managed by the current
  // DofHandler object
  for (lf::assemble::gdof_idx_t dof_idx = 0; dof_idx < N_dofs; dof_idx++) {
    const lf::mesh::Entity &e(dofh.Entity(dof_idx));
    std::cout << "dof " << dof_idx << " -> " << e << " " << mesh->Index(e)
              << '\n';
  }
}